

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

void __thiscall
lest::passing::passing(passing *this,location *where_,text *expr_,text *decomposition_,bool zen)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long *plVar3;
  ulong *puVar4;
  undefined8 uVar5;
  _Alloc_hider _Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  undefined8 local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  undefined8 local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  text local_b8;
  text local_98;
  text local_78;
  location local_58;
  
  local_d8 = &local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"passed","");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  if (local_d8 == &local_c8) {
    local_b8.field_2._8_4_ = local_c8._8_4_;
    local_b8.field_2._12_4_ = local_c8._12_4_;
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)local_d8;
  }
  local_b8.field_2._M_allocated_capacity._4_4_ = local_c8._M_allocated_capacity._4_4_;
  local_b8.field_2._M_allocated_capacity._0_4_ = local_c8._M_allocated_capacity._0_4_;
  local_b8._M_string_length = local_d0;
  local_d0 = 0;
  local_c8._M_allocated_capacity._0_4_ = local_c8._M_allocated_capacity._0_4_ & 0xffffff00;
  paVar1 = &local_58.file.field_2;
  pcVar2 = (where_->file)._M_dataplus._M_p;
  local_d8 = &local_c8;
  local_58.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (where_->file)._M_string_length);
  local_58.line = where_->line;
  if (zen) {
    local_f8 = &local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
    if (local_f8 == &local_e8) {
      local_178.field_2._8_8_ = local_e8._8_8_;
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    }
    else {
      local_178._M_dataplus._M_p = (pointer)local_f8;
    }
    local_178.field_2._M_allocated_capacity._1_7_ = local_e8._M_allocated_capacity._1_7_;
    local_178.field_2._M_local_buf[0] = local_e8._M_local_buf[0];
    local_f0 = 0;
    local_e8._M_local_buf[0] = '\0';
    local_138[0] = &local_128;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p == &local_178.field_2) {
      local_128._8_8_ = local_178.field_2._8_8_;
      local_f8 = &local_e8;
    }
    else {
      local_138[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_178._M_dataplus._M_p;
      local_f8 = &local_e8;
    }
  }
  else {
    std::operator+(&local_178," for ",decomposition_);
    local_138[0] = &local_128;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p == &local_178.field_2) {
      local_128._8_8_ = local_178.field_2._8_8_;
    }
    else {
      local_138[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_178._M_dataplus._M_p;
    }
  }
  local_128._M_allocated_capacity = local_178.field_2._M_allocated_capacity;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_allocated_capacity =
       local_178.field_2._M_allocated_capacity & 0xffffffffffffff00;
  plVar3 = (long *)std::__cxx11::string::replace
                             ((ulong)local_138,0,(char *)0x0,(ulong)(expr_->_M_dataplus)._M_p);
  puVar4 = (ulong *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar4) {
    local_148._M_allocated_capacity = *puVar4;
    local_148._8_4_ = (undefined4)plVar3[3];
    local_148._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
    local_158 = &local_148;
  }
  else {
    local_148._M_allocated_capacity = *puVar4;
    local_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar3;
  }
  local_98._M_string_length = plVar3[1];
  *plVar3 = (long)puVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_158 == &local_148) {
    local_98.field_2._8_4_ = local_148._8_4_;
    local_98.field_2._12_4_ = local_148._12_4_;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  else {
    local_98._M_dataplus._M_p = (pointer)local_158;
  }
  local_98.field_2._M_allocated_capacity = local_148._M_allocated_capacity;
  local_150 = 0;
  local_148._M_allocated_capacity = local_148._M_allocated_capacity & 0xffffffffffffff00;
  local_158 = &local_148;
  local_118 = &local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
  if (local_118 == &local_108) {
    local_78.field_2._8_8_ = local_108._8_8_;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
  else {
    local_78._M_dataplus._M_p = (pointer)local_118;
  }
  local_78.field_2._M_allocated_capacity._1_7_ = local_108._M_allocated_capacity._1_7_;
  local_78.field_2._M_local_buf[0] = local_108._M_local_buf[0];
  local_78._M_string_length = local_110;
  local_110 = 0;
  local_108._M_local_buf[0] = '\0';
  local_118 = &local_108;
  success::success(&this->super_success,&local_b8,&local_58,&local_98,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,
                    CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148._M_allocated_capacity + 1);
  }
  if (local_138[0] != &local_128) {
    operator_delete(local_138[0],local_128._M_allocated_capacity + 1);
  }
  if (zen) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    if (local_f8 == &local_e8) goto LAB_001e20fe;
    uVar5 = CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]);
    _Var6._M_p = (pointer)local_f8;
  }
  else {
    uVar5 = local_178.field_2._M_allocated_capacity;
    _Var6._M_p = local_178._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p == &local_178.field_2) goto LAB_001e20fe;
  }
  operator_delete(_Var6._M_p,uVar5 + 1);
LAB_001e20fe:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.file._M_dataplus._M_p,local_58.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,CONCAT44(local_c8._M_allocated_capacity._4_4_,
                                      local_c8._M_allocated_capacity._0_4_) + 1);
  }
  *(undefined ***)&(this->super_success).super_message = &PTR__message_001febd0;
  return;
}

Assistant:

passing( location where_, text expr_, text decomposition_, bool zen )
    : success( "passed", where_, expr_ + (zen ? "":" for " + decomposition_) ) {}